

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneDiffer.cpp
# Opt level: O3

string * __thiscall
Assimp::dumpFace_abi_cxx11_(string *__return_storage_ptr__,Assimp *this,aiFace *face)

{
  string *psVar1;
  char *pcVar2;
  ulong uVar3;
  bool bVar4;
  stringstream stream;
  stringstream asStack_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(asStack_1b8);
  if (*(int *)this != 0) {
    uVar3 = 0;
    do {
      std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      bVar4 = uVar3 < *(int *)this - 1;
      pcVar2 = "\n";
      if (bVar4) {
        pcVar2 = ", ";
      }
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,pcVar2,(ulong)bVar4 + 1);
      uVar3 = uVar3 + 1;
    } while (uVar3 < *(uint *)this);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_1b8);
  psVar1 = (string *)std::ios_base::~ios_base(local_138);
  return psVar1;
}

Assistant:

static std::string dumpFace( const aiFace &face ) {
    std::stringstream stream;
    for ( unsigned int i = 0; i < face.mNumIndices; i++ ) {
        stream << face.mIndices[ i ];
        if ( i < face.mNumIndices - 1 ) {
            stream << ", ";
        }
        else {
            stream << "\n";
        }
    }
    return stream.str();
}